

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void envy_bios_print_mem_train(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *__format;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar3 = strap;
  uVar1 = (bios->mem).train.offset;
  if ((mask >> 0xc & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar7 = strap >> 2;
  fprintf((FILE *)out,"MEM TRAIN table at 0x%x, version %x\n",(ulong)uVar1,
          (ulong)(bios->mem).train.version);
  fprintf((FILE *)out,"Training clock: %huMHz\n\n",(ulong)(bios->mem).train.mclk);
  envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.offset,(uint)(bios->mem).train.hlen,mask);
  if ((int)mask < 0) {
    fputc(10,(FILE *)out);
  }
  fwrite("Type | ",7,1,(FILE *)out);
  uVar7 = uVar7 & 7;
  if (uVar3 == 0) {
    uVar7 = 0xff;
  }
  for (uVar5 = 0; uVar5 < (bios->mem).train.subentries; uVar5 = uVar5 + 1) {
    if (uVar7 == uVar5) {
      __format = "%2u* ";
      uVar2 = uVar7;
    }
    else {
      __format = "%2u  ";
      uVar2 = uVar5;
    }
    fprintf((FILE *)out,__format,(ulong)uVar2);
  }
  fputc(10,(FILE *)out);
  for (uVar7 = 0; uVar7 < (uint)(bios->mem).train.subentries * 4 + 6; uVar7 = uVar7 + 1) {
    fputc(0x2d,(FILE *)out);
  }
  fputc(10,(FILE *)out);
  lVar6 = 3;
  for (uVar4 = 0; uVar4 < (bios->mem).train.entriesnum; uVar4 = uVar4 + 1) {
    fprintf((FILE *)out,"  %02hhx |",(ulong)(bios->mem).train.entries[uVar4].u00);
    for (uVar8 = 0; uVar8 < (bios->mem).train.subentries; uVar8 = uVar8 + 1) {
      fprintf((FILE *)out," %02hhx ",
              (ulong)((bios->mem).train.entries)->subentry[uVar8 + lVar6 + -3]);
    }
    fputc(10,(FILE *)out);
    envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.entries[uVar4].offset,
                       (uint)(bios->mem).train.rlen,mask);
    envy_bios_dump_hex(bios,out,(uint)(bios->mem).train.rlen +
                                (uint)(bios->mem).train.entries[uVar4].offset,
                       (uint)(bios->mem).train.subentries * (uint)(bios->mem).train.subentrylen,mask
                      );
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    lVar6 = lVar6 + 0xc;
  }
  fputc(10,(FILE *)out);
  return;
}

Assistant:

void
envy_bios_print_mem_train(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;
	int i, j;

	if (!mt->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TRAIN table at 0x%x, version %x\n", mt->offset, mt->version);
	fprintf(out, "Training clock: %huMHz\n\n", mt->mclk);
	envy_bios_dump_hex(bios, out, mt->offset, mt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	fprintf(out, "Type | ");
	for (i = 0; i < mt->subentries; i++)
		if (i == ram_cfg)
			fprintf(out, "%2u* ", i);
		else
			fprintf(out, "%2u  ", i);
	fprintf(out, "\n");
	for (i = 0; i < mt->subentries * 4 + 6; i++)
		fprintf(out,"-");
	fprintf(out, "\n");

	for (i = 0; i < mt->entriesnum; i++) {
		fprintf(out, "  %02hhx |",
			mt->entries[i].u00);

		for (j = 0; j < mt->subentries; j++) {
			fprintf(out, " %02hhx ",
				mt->entries[i].subentry[j]);
		}
		fprintf(out, "\n");

		envy_bios_dump_hex(bios, out, mt->entries[i].offset, mt->rlen, mask);
		envy_bios_dump_hex(bios, out, mt->entries[i].offset+mt->rlen, mt->subentrylen * mt->subentries, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	}

	fprintf(out, "\n");
}